

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

string * __thiscall
smf::Options::getString(string *__return_storage_ptr__,Options *this,string *optionName)

{
  Option_register *pOVar1;
  uint uVar2;
  allocator local_11;
  
  uVar2 = getRegIndex(this,optionName);
  if ((int)uVar2 < 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"UNKNOWN OPTION",&local_11);
  }
  else {
    pOVar1 = (this->m_optionRegister).
             super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar2];
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)(&pOVar1->m_defaultOption + pOVar1->m_modifiedQ));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Options::getString(const std::string& optionName) {
	int index = getRegIndex(optionName);
	if (index < 0) {
		return "UNKNOWN OPTION";
	} else {
		return m_optionRegister[index]->getOption();
	}
}